

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void push_sorted_suite::run(void)

{
  push_increasing();
  push_increasing_predicate();
  push_decreasing();
  push_decreasing_predicate();
  push_alternating();
  push_alternating_predicate();
  return;
}

Assistant:

void run()
{
    push_increasing();
    push_increasing_predicate();
    push_decreasing();
    push_decreasing_predicate();
    push_alternating();
    push_alternating_predicate();
}